

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pyVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  istream *piVar10;
  ggml_context *ctx;
  ggml_cgraph *gf;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  long lVar14;
  int i;
  ulong uVar15;
  int j;
  ulong uVar16;
  yolo_model model;
  vector<yolo_image,_std::allocator<yolo_image>_> alphabet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  yolo_image img;
  undefined4 uStack_2b0;
  undefined7 uStack_2a7;
  yolo_params params;
  ifstream file_in;
  byte abStack_218 [488];
  
  ggml_time_init();
  model.width = 0x1a0;
  model.height = 0x1a0;
  model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  model.backend = (ggml_backend_t)0x0;
  yolo_params::yolo_params(&params);
  yolo_params_parse(argc,argv,&params);
  if (model.backend == (ggml_backend_t)0x0) {
    model.backend = (ggml_backend_t)ggml_backend_cpu_init();
  }
  alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar6 = gguf_init_from_file(params.model._M_dataplus._M_p,0);
  if (lVar6 == 0) {
    fprintf(_stderr,"%s: gguf_init_from_file() failed\n","load_model");
    fprintf(_stderr,"%s: failed to load model from \'%s\'\n","main",params.model._M_dataplus._M_p);
    iVar4 = 1;
  }
  else {
    uVar3 = gguf_get_n_tensors(lVar6);
    lVar7 = ggml_tensor_overhead();
    img._0_8_ = lVar7 * (int)uVar3;
    img.c = 0;
    img._12_4_ = 0;
    img.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = 1;
    model.ctx = (ggml_context *)ggml_init();
    uVar16 = 0;
    uVar15 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar15 = uVar16;
    }
    for (; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      uVar8 = gguf_get_tensor_name(lVar6,uVar16);
      uVar9 = ggml_get_tensor(alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>.
                              _M_impl.super__Vector_impl_data._M_start,uVar8);
      uVar9 = ggml_dup_tensor(model.ctx,uVar9);
      ggml_set_name(uVar9,uVar8);
    }
    model.buffer = (ggml_backend_buffer_t)ggml_backend_alloc_ctx_tensors(model.ctx,model.backend);
    for (lVar7 = ggml_get_first_tensor(model.ctx);
        pyVar1 = alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
                 super__Vector_impl_data._M_start, lVar7 != 0;
        lVar7 = ggml_get_next_tensor(model.ctx,lVar7)) {
      uVar8 = ggml_get_name(lVar7);
      uVar8 = ggml_get_tensor(pyVar1,uVar8);
      uVar9 = ggml_nbytes(uVar8);
      uVar8 = ggml_get_data(uVar8);
      ggml_backend_tensor_set(lVar7,uVar8,0,uVar9);
    }
    gguf_free(lVar6);
    model.width = 0x1a0;
    model.height = 0x1a0;
    std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::resize(&model.conv2d_layers,0xd);
    model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[7].padding = 0;
    model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[9].padding = 0;
    model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[9].batch_normalize = false;
    model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[9].activate = false;
    model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[10].padding = 0;
    model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[0xc].padding = 0;
    model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[0xc].batch_normalize = false;
    model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
    super__Vector_impl_data._M_start[0xc].activate = false;
    lVar6 = 0;
    for (uVar15 = 0;
        (long)uVar15 <
        (long)(int)(((long)model.conv2d_layers.
                           super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)model.conv2d_layers.
                          super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x30); uVar15 = uVar15 + 1) {
      snprintf((char *)&file_in,0x100,"l%d_weights",uVar15 & 0xffffffff);
      uVar8 = ggml_get_tensor(model.ctx,&file_in);
      *(undefined8 *)
       ((long)&(model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                _M_impl.super__Vector_impl_data._M_start)->weights + lVar6) = uVar8;
      snprintf((char *)&file_in,0x100,"l%d_biases",uVar15 & 0xffffffff);
      uVar8 = ggml_get_tensor(model.ctx);
      *(undefined8 *)
       ((long)&(model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                _M_impl.super__Vector_impl_data._M_start)->biases + lVar6) = uVar8;
      if ((&(model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
             _M_impl.super__Vector_impl_data._M_start)->batch_normalize)[lVar6] == true) {
        snprintf((char *)&file_in,0x100,"l%d_scales",uVar15 & 0xffffffff);
        uVar8 = ggml_get_tensor(model.ctx,&file_in);
        *(undefined8 *)
         ((long)&(model.conv2d_layers.
                  super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                  super__Vector_impl_data._M_start)->scales + lVar6) = uVar8;
        snprintf((char *)&file_in,0x100,"l%d_rolling_mean",uVar15 & 0xffffffff);
        uVar8 = ggml_get_tensor(model.ctx,&file_in);
        *(undefined8 *)
         ((long)&(model.conv2d_layers.
                  super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                  super__Vector_impl_data._M_start)->rolling_mean + lVar6) = uVar8;
        snprintf((char *)&file_in,0x100,"l%d_rolling_variance",uVar15 & 0xffffffff);
        uVar8 = ggml_get_tensor(model.ctx);
        *(undefined8 *)
         ((long)&(model.conv2d_layers.
                  super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>._M_impl.
                  super__Vector_impl_data._M_start)->rolling_variance + lVar6) = uVar8;
      }
      lVar6 = lVar6 + 0x30;
    }
    yolo_image::yolo_image(&img,0,0,0);
    bVar2 = load_image(params.fname_inp._M_dataplus._M_p,&img);
    if (bVar2) {
      labels.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      labels.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      labels.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::ifstream::ifstream(&file_in,"data/coco.names",_S_in);
      if ((abStack_218[*(long *)(_file_in + -0x18)] & 5) == 0) {
        alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        while( true ) {
          piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&file_in,(string *)&alphabet);
          if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&labels,(value_type *)&alphabet);
        }
        if ((long)labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)labels.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0xa00) {
          uVar8 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/yolo/yolov3-tiny.cpp"
                             ,0xb2,"GGML_ASSERT(%s) failed","labels.size() == 80");
          std::vector<yolo_image,_std::allocator<yolo_image>_>::~vector(&alphabet);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&labels);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&img.data.super__Vector_base<float,_std::allocator<float>_>);
          yolo_params::~yolo_params(&params);
          std::_Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>::~_Vector_base
                    (&model.conv2d_layers.
                      super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>);
          _Unwind_Resume(uVar8);
        }
        std::__cxx11::string::~string((string *)&alphabet);
        std::ifstream::~ifstream(&file_in);
        alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        alphabet.super__Vector_base<yolo_image,_std::allocator<yolo_image>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<yolo_image,_std::allocator<yolo_image>_>::resize(&alphabet,0x400);
        lVar6 = 0x500;
        for (uVar15 = 0; uVar15 != 8; uVar15 = uVar15 + 1) {
          lVar14 = lVar6;
          for (lVar7 = -0x5f; lVar7 != 0; lVar7 = lVar7 + 1) {
            snprintf((char *)&file_in,0x100,"data/labels/%d_%d.png",(ulong)((int)lVar7 + 0x7f),
                     uVar15 & 0xffffffff);
            bVar2 = load_image((char *)&file_in,
                               (yolo_image *)
                               ((long)&(alphabet.
                                        super__Vector_base<yolo_image,_std::allocator<yolo_image>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->w + lVar14));
            if (!bVar2) {
              fprintf(_stderr,"Cannot load \'%s\'\n",&file_in);
              fprintf(_stderr,"%s: failed to load alphabet\n","main");
              iVar4 = 1;
              goto LAB_001061ec;
            }
            lVar14 = lVar14 + 0x28;
          }
          lVar6 = lVar6 + 0x1400;
        }
        iVar4 = ggml_tensor_overhead();
        iVar5 = ggml_graph_overhead();
        iVar5 = iVar5 + iVar4 * 0x800;
        uVar8 = CONCAT71(uStack_2a7,1);
        uStack_2b0 = 0;
        ctx = (ggml_context *)ggml_init();
        gf = (ggml_cgraph *)ggml_new_graph(ctx);
        pgVar11 = (ggml_tensor *)
                  ggml_new_tensor_4d(ctx,0,(long)model.width,(long)model.height,3,1,iVar5,uStack_2b0
                                     ,uVar8);
        ggml_set_name(pgVar11,"input");
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start);
        print_shape(0,pgVar11);
        pgVar11 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        print_shape(1,pgVar11);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1);
        print_shape(2,pgVar11);
        pgVar11 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        print_shape(3,pgVar11);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 2);
        print_shape(4,pgVar11);
        pgVar11 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        print_shape(5,pgVar11);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 3);
        print_shape(6,pgVar11);
        pgVar11 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        print_shape(7,pgVar11);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4);
        print_shape(8,pgVar11);
        pgVar12 = (ggml_tensor *)ggml_pool_2d(0,0,ctx,pgVar11,0,2,2,2,2);
        print_shape(9,pgVar12);
        pgVar12 = apply_conv2d(ctx,pgVar12,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 5);
        print_shape(10,pgVar12);
        iVar4 = 1;
        pgVar12 = (ggml_tensor *)ggml_pool_2d(0x3f000000,0x3f000000,ctx,pgVar12,0,2,2,1,1);
        print_shape(0xb,pgVar12);
        pgVar12 = apply_conv2d(ctx,pgVar12,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 6);
        print_shape(0xc,pgVar12);
        pgVar12 = apply_conv2d(ctx,pgVar12,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 7);
        print_shape(0xd,pgVar12);
        pgVar13 = apply_conv2d(ctx,pgVar12,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 8);
        print_shape(0xe,pgVar13);
        pgVar13 = apply_conv2d(ctx,pgVar13,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 9);
        ggml_set_output(pgVar13);
        ggml_set_name(pgVar13,"layer_15");
        print_shape(0xf,pgVar13);
        pgVar12 = apply_conv2d(ctx,pgVar12,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 10);
        print_shape(0x12,pgVar12);
        pgVar12 = (ggml_tensor *)ggml_upscale(ctx,pgVar12,2,0);
        print_shape(0x13,pgVar12);
        pgVar11 = (ggml_tensor *)ggml_concat(ctx,pgVar12,pgVar11,2);
        print_shape(0x14,pgVar11);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 0xb);
        print_shape(0x15,pgVar11);
        pgVar11 = apply_conv2d(ctx,pgVar11,
                               model.conv2d_layers.
                               super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>.
                               _M_impl.super__Vector_impl_data._M_start + 0xc);
        ggml_set_output(pgVar11);
        ggml_set_name(pgVar11,"layer_22");
        print_shape(0x16,pgVar11);
        ggml_build_forward_expand(gf,pgVar13);
        ggml_build_forward_expand(gf,pgVar11);
        uVar8 = ggml_backend_get_default_buffer_type(model.backend);
        uVar8 = ggml_gallocr_new(uVar8);
        ggml_gallocr_alloc_graph(uVar8,gf);
        lVar6 = ggml_time_ms();
        detect(&img,gf,&model,params.thresh,&labels,&alphabet);
        lVar7 = ggml_time_ms();
        bVar2 = save_image(&img,params.fname_out._M_dataplus._M_p,0x50);
        if (bVar2) {
          printf("Detected objects saved in \'%s\' (time: %f sec.)\n",
                 SUB84((double)((float)(lVar7 - lVar6) / 1000.0),0),
                 params.fname_out._M_dataplus._M_p);
          ggml_free(ctx);
          ggml_gallocr_free(uVar8);
          ggml_free(model.ctx);
          ggml_backend_buffer_free(model.buffer);
          iVar4 = 0;
          ggml_backend_free(model.backend);
        }
        else {
          fprintf(_stderr,"%s: failed to save image to \'%s\'\n","main",
                  params.fname_out._M_dataplus._M_p);
        }
LAB_001061ec:
        std::vector<yolo_image,_std::allocator<yolo_image>_>::~vector(&alphabet);
      }
      else {
        std::ifstream::~ifstream(&file_in);
        fprintf(_stderr,"%s: failed to load labels from \'data/coco.names\'\n","main");
        iVar4 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&labels);
    }
    else {
      fprintf(_stderr,"%s: failed to load image from \'%s\'\n","main",
              params.fname_inp._M_dataplus._M_p);
      iVar4 = 1;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&img.data.super__Vector_base<float,_std::allocator<float>_>);
  }
  yolo_params::~yolo_params(&params);
  std::_Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>::~_Vector_base
            (&model.conv2d_layers.super__Vector_base<conv2d_layer,_std::allocator<conv2d_layer>_>);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    ggml_time_init();
    yolo_model model;

    yolo_params params;
    if (!yolo_params_parse(argc, argv, params)) {
        return 1;
    }
    if (!load_model(params.model, model)) {
        fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
        return 1;
    }
    yolo_image img(0,0,0);
    if (!load_image(params.fname_inp.c_str(), img)) {
        fprintf(stderr, "%s: failed to load image from '%s'\n", __func__, params.fname_inp.c_str());
        return 1;
    }
    std::vector<std::string> labels;
    if (!load_labels("data/coco.names", labels)) {
        fprintf(stderr, "%s: failed to load labels from 'data/coco.names'\n", __func__);
        return 1;
    }
    std::vector<yolo_image> alphabet;
    if (!load_alphabet(alphabet)) {
        fprintf(stderr, "%s: failed to load alphabet\n", __func__);
        return 1;
    }

    struct ggml_init_params params0 = {
        /*.mem_size   =*/ ggml_tensor_overhead()*GGML_DEFAULT_GRAPH_SIZE + ggml_graph_overhead(),
        /*.mem_buffer =*/ NULL,
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };
    struct ggml_context * ctx_cgraph = ggml_init(params0);
    struct ggml_cgraph * gf = build_graph(ctx_cgraph, model);

    ggml_gallocr_t allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(model.backend));
    ggml_gallocr_alloc_graph(allocr, gf);

    const int64_t t_start_ms = ggml_time_ms();
    detect(img, gf, model, params.thresh, labels, alphabet);
    const int64_t t_detect_ms = ggml_time_ms() - t_start_ms;
    if (!save_image(img, params.fname_out.c_str(), 80)) {
        fprintf(stderr, "%s: failed to save image to '%s'\n", __func__, params.fname_out.c_str());
        return 1;
    }
    printf("Detected objects saved in '%s' (time: %f sec.)\n", params.fname_out.c_str(), t_detect_ms / 1000.0f);

    ggml_free(ctx_cgraph);
    ggml_gallocr_free(allocr);
    ggml_free(model.ctx);
    ggml_backend_buffer_free(model.buffer);
    ggml_backend_free(model.backend);
    return 0;
}